

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_aa461::ReplaceValueUsersWith
               (VmModule *module,VmValue *original,VmValue *replacement,uint *optCount)

{
  VmFunction *pVVar1;
  bool bVar2;
  uint uVar3;
  VmValue **ppVVar4;
  VmBlock *pVVar5;
  VmBlock **ppVVar6;
  uint local_44;
  uint i_1;
  VmFunction *function;
  VmBlock *block;
  uint i;
  uint *optCount_local;
  VmValue *replacement_local;
  VmValue *original_local;
  VmModule *module_local;
  
  bVar2 = SmallArray<VmValue_*,_128U>::empty(&module->tempUsers);
  if (bVar2) {
    uVar3 = SmallArray<VmValue_*,_8U>::size(&original->users);
    SmallArray<VmValue_*,_128U>::reserve(&module->tempUsers,uVar3);
    ppVVar4 = (original->users).data;
    uVar3 = SmallArray<VmValue_*,_8U>::size(&original->users);
    SmallArray<VmValue_*,_128U>::push_back(&module->tempUsers,ppVVar4,uVar3);
    for (block._4_4_ = 0; uVar3 = SmallArray<VmValue_*,_128U>::size(&module->tempUsers),
        block._4_4_ < uVar3; block._4_4_ = block._4_4_ + 1) {
      ppVVar4 = SmallArray<VmValue_*,_128U>::operator[](&module->tempUsers,block._4_4_);
      ReplaceValue(module,*ppVVar4,original,replacement);
    }
    pVVar5 = getType<VmBlock>(original);
    if (pVVar5 != (VmBlock *)0x0) {
      pVVar1 = pVVar5->parent;
      for (local_44 = 0; uVar3 = SmallArray<VmBlock_*,_4U>::size(&pVVar1->restoreBlocks),
          local_44 < uVar3; local_44 = local_44 + 1) {
        ppVVar6 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->restoreBlocks,local_44);
        if ((VmBlock *)original == *ppVVar6) {
          pVVar5 = getType<VmBlock>(replacement);
          ppVVar6 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->restoreBlocks,local_44);
          *ppVVar6 = pVVar5;
        }
      }
    }
    if (optCount != (uint *)0x0) {
      *optCount = *optCount + 1;
    }
    SmallArray<VmValue_*,_128U>::clear(&module->tempUsers);
    return;
  }
  __assert_fail("module->tempUsers.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x48e,
                "void (anonymous namespace)::ReplaceValueUsersWith(VmModule *, VmValue *, VmValue *, unsigned int *)"
               );
}

Assistant:

void ReplaceValueUsersWith(VmModule *module, VmValue *original, VmValue *replacement, unsigned *optCount)
	{
		assert(module->tempUsers.empty());

		module->tempUsers.reserve(original->users.size());
		module->tempUsers.push_back(original->users.data, original->users.size());

		for(unsigned i = 0; i < module->tempUsers.size(); i++)
			ReplaceValue(module, module->tempUsers[i], original, replacement);

		if(VmBlock *block = getType<VmBlock>(original))
		{
			VmFunction *function = block->parent;

			for(unsigned i = 0; i < function->restoreBlocks.size(); i++)
			{
				if(original == function->restoreBlocks[i])
					function->restoreBlocks[i] = getType<VmBlock>(replacement);
			}
		}

		if(optCount)
			(*optCount)++;

		module->tempUsers.clear();
	}